

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
* Vector<util_tests::(anonymous_namespace)::Tracker,util_tests::(anonymous_namespace)::Tracker&,util_tests::(anonymous_namespace)::Tracker>
            (Tracker *args,Tracker *args_1,Tracker *args_2)

{
  Tracker *in_RDI;
  long in_FS_OFFSET;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *ret;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *in_stack_ffffffffffffff78;
  undefined4 *puVar1;
  Tracker *this;
  size_type in_stack_ffffffffffffffb0;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *in_stack_ffffffffffffffb8;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::vector(in_stack_ffffffffffffff78);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>
            ((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)this,in_RDI);
  puVar1 = &local_10;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker&>
            ((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)this,in_RDI);
  *puVar1 = 0;
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::emplace_back<util_tests::(anonymous_namespace)::Tracker>
            ((vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)this,in_RDI);
  local_c = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
          *)in_RDI;
}

Assistant:

inline std::vector<typename std::common_type<Args...>::type> Vector(Args&&... args)
{
    std::vector<typename std::common_type<Args...>::type> ret;
    ret.reserve(sizeof...(args));
    // The line below uses the trick from https://www.experts-exchange.com/articles/32502/None-recursive-variadic-templates-with-std-initializer-list.html
    (void)std::initializer_list<int>{(ret.emplace_back(std::forward<Args>(args)), 0)...};
    return ret;
}